

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O1

void SignalProcessing::FIRFilter::coefficients_for_idealised_filter_response
               (short *filter_coefficients,float *A,float attenuation,size_t number_of_taps)

{
  float fVar1;
  pointer pfVar2;
  size_t sVar3;
  long lVar4;
  uint i;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float ds;
  float fVar9;
  float fVar10;
  float s_1;
  float fVar11;
  float ds_1;
  float fVar12;
  float d;
  float fVar13;
  float s;
  float fVar14;
  vector<float,_std::allocator<float>_> filter_coefficients_float;
  allocator_type local_5d;
  float local_5c;
  float local_58;
  float local_54;
  vector<float,_std::allocator<float>_> local_50;
  ulong local_38;
  
  local_5c = 0.0;
  if (21.0 <= attenuation) {
    if (attenuation <= 50.0) {
      fVar14 = powf(attenuation + -21.0,0.4);
      local_5c = fVar14 * 0.5842 + (attenuation + -21.0) * 0.7886;
    }
    else {
      local_5c = (attenuation + -8.7) * 0.1102;
    }
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_50,number_of_taps,&local_5d);
  fVar13 = 0.0;
  local_38 = number_of_taps - 1;
  fVar9 = 1.0;
  fVar14 = 1.0;
  do {
    fVar13 = fVar13 + 2.0;
    fVar9 = fVar9 * ((local_5c * local_5c) / (fVar13 * fVar13));
    fVar14 = fVar14 + fVar9;
  } while (fVar14 * 1e-06 < fVar9);
  uVar7 = local_38 >> 1;
  fVar13 = (float)(uVar7 * uVar7);
  uVar6 = 0;
  fVar9 = local_5c;
  local_58 = fVar13;
  local_54 = fVar14;
  do {
    fVar1 = A[uVar6];
    iVar5 = (int)uVar6;
    fVar8 = 1.0 - (float)(uint)(iVar5 * iVar5) / fVar13;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
      fVar9 = local_5c;
      fVar14 = local_54;
      fVar13 = local_58;
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar10 = 0.0;
    fVar12 = 1.0;
    fVar11 = 1.0;
    do {
      fVar10 = fVar10 + 2.0;
      fVar12 = fVar12 * ((fVar8 * fVar9 * fVar8 * fVar9) / (fVar10 * fVar10));
      fVar11 = fVar11 + fVar12;
    } while (fVar11 * 1e-06 < fVar12);
    local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar7 + uVar6] = (fVar1 * fVar11) / fVar14;
    uVar6 = (ulong)(iVar5 + 1);
  } while (uVar6 <= uVar7);
  if (1 < local_38) {
    pfVar2 = local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start + number_of_taps;
    lVar4 = 0;
    do {
      pfVar2 = pfVar2 + -1;
      local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = *pfVar2;
      lVar4 = lVar4 + 1;
    } while (uVar7 + (uVar7 == 0) != lVar4);
  }
  fVar14 = 0.0;
  if (number_of_taps != 0) {
    sVar3 = 0;
    do {
      fVar14 = fVar14 + local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar3];
      sVar3 = sVar3 + 1;
    } while (number_of_taps != sVar3);
  }
  if (number_of_taps != 0) {
    sVar3 = 0;
    do {
      filter_coefficients[sVar3] =
           (short)(int)(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start[sVar3] * 32767.0 * (1.0 / fVar14));
      sVar3 = sVar3 + 1;
    } while (number_of_taps != sVar3);
  }
  if (local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FIRFilter::coefficients_for_idealised_filter_response(short *filter_coefficients, float *A, float attenuation, std::size_t number_of_taps) {
	/* calculate alpha, which is the Kaiser-Bessel window shape factor */
	float a;	// to take the place of alpha in the normal derivation

	if(attenuation < 21.0f) {
		a = 0.0f;
	} else {
		if(attenuation > 50.0f)
			a = 0.1102f * (attenuation - 8.7f);
		else
			a = 0.5842f * powf(attenuation - 21.0f, 0.4f) + 0.7886f * (attenuation - 21.0f);
	}

	std::vector<float> filter_coefficients_float(number_of_taps);

	/* work out the right hand side of the filter coefficients */
	std::size_t Np = (number_of_taps - 1) / 2;
	float I0 = ino(a);
	float Np_squared = float(Np * Np);
	for(unsigned int i = 0; i <= Np; ++i) {
		filter_coefficients_float[Np + i] =
				A[i] *
				ino(a * sqrtf(1.0f - (float(i * i) / Np_squared) )) /
				I0;
	}

	/* coefficients are symmetrical, so copy from right hand side to left side */
	for(std::size_t i = 0; i < Np; ++i) {
		filter_coefficients_float[i] = filter_coefficients_float[number_of_taps - 1 - i];
	}

	/* scale back up so that we retain 100% of input volume */
	float coefficientTotal = 0.0f;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		coefficientTotal += filter_coefficients_float[i];
	}

	/* we'll also need integer versions, potentially */
	float coefficientMultiplier = 1.0f / coefficientTotal;
	for(std::size_t i = 0; i < number_of_taps; ++i) {
		filter_coefficients[i] = short(filter_coefficients_float[i] * FixedMultiplier * coefficientMultiplier);
	}
}